

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FunctionBody * __thiscall
ByteCodeGenerator::MakeGlobalFunctionBody(ByteCodeGenerator *this,ParseNode *pnode)

{
  undefined1 *puVar1;
  uint nestedCount;
  uint uScriptId;
  ScriptContext *scriptContext;
  Utf8SourceInfo *sourceInfo;
  ParseNodeFnc *pPVar2;
  FunctionBody *func;
  
  scriptContext = this->scriptContext;
  pPVar2 = ParseNode::AsParseNodeFnc(pnode);
  nestedCount = pPVar2->nestedCount;
  sourceInfo = this->m_utf8SourceInfo;
  uScriptId = ((((sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  pPVar2 = ParseNode::AsParseNodeFnc(pnode);
  func = Js::FunctionBody::NewFromRecycler
                   (scriptContext,L"glo",3,0,nestedCount,sourceInfo,uScriptId,pPVar2->functionId,
                    None,Flags_HasNoExplicitReturnValue);
  puVar1 = &(func->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 0x10;
  Js::JavascriptLibrary::RegisterDynamicFunctionReference
            ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,(FunctionProxy *)func)
  ;
  return func;
}

Assistant:

Js::FunctionBody * ByteCodeGenerator::MakeGlobalFunctionBody(ParseNode *pnode)
{
    Js::FunctionBody * func;

    func =
        Js::FunctionBody::NewFromRecycler(
            scriptContext,
            Js::Constants::GlobalFunction,
            Js::Constants::GlobalFunctionLength,
            0,
            pnode->AsParseNodeFnc()->nestedCount,
            m_utf8SourceInfo,
            m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
            pnode->AsParseNodeFnc()->functionId,
            Js::FunctionInfo::Attributes::None,
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

    func->SetIsGlobalFunc(true);

    scriptContext->GetLibrary()->RegisterDynamicFunctionReference(func);

    return func;
}